

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void DiscardContainer(TidyDocImpl *doc,Node *element,Node **pnode)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node **ppNVar5;
  
  pNVar4 = element->content;
  if (pNVar4 != (Node *)0x0) {
    pNVar1 = element->parent;
    pNVar2 = element->next;
    pNVar3 = element->last;
    ppNVar5 = &pNVar2->prev;
    if (pNVar2 == (Node *)0x0) {
      ppNVar5 = &pNVar1->last;
    }
    pNVar3->next = pNVar2;
    *ppNVar5 = pNVar3;
    if (element->prev == (Node *)0x0) {
      ppNVar5 = &pNVar1->content;
    }
    else {
      pNVar4->prev = element->prev;
      ppNVar5 = &element->prev->next;
    }
    *ppNVar5 = pNVar4;
    pNVar4 = element->content;
    if (pNVar4 == (Node *)0x0) {
      pNVar4 = (Node *)0x0;
    }
    else {
      do {
        pNVar4->parent = pNVar1;
        pNVar4 = pNVar4->next;
      } while (pNVar4 != (Node *)0x0);
      pNVar4 = element->content;
    }
    *pnode = pNVar4;
    element->next = (Node *)0x0;
    element->content = (Node *)0x0;
    prvTidyFreeNode(doc,element);
    return;
  }
  pNVar4 = prvTidyDiscardElement(doc,element);
  *pnode = pNVar4;
  return;
}

Assistant:

static void DiscardContainer( TidyDocImpl* doc, Node *element, Node **pnode)
{
    if (element->content)
    {
        Node *node, *parent = element->parent;

        element->last->next = element->next;

        if (element->next)
        {
            element->next->prev = element->last;
        }
        else
            parent->last = element->last;

        if (element->prev)
        {
            element->content->prev = element->prev;
            element->prev->next = element->content;
        }
        else
            parent->content = element->content;

        for (node = element->content; node; node = node->next)
            node->parent = parent;

        *pnode = element->content;

        element->next = element->content = NULL;
        TY_(FreeNode)(doc, element);
    }
    else
    {
        *pnode = TY_(DiscardElement)(doc, element);
    }
}